

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  CImg<unsigned_int> *pCVar6;
  bool bVar7;
  uchar *ptrp0;
  uint *puVar8;
  byte *pbVar9;
  uint *puVar10;
  float *pfVar11;
  float *pfVar12;
  CImgArgumentException *this_00;
  long lVar13;
  float *pfVar14;
  uint *puVar15;
  int x;
  int iVar16;
  uint uVar17;
  uint *puVar18;
  float *pfVar19;
  float *pfVar20;
  uint *puVar21;
  float *pfVar22;
  ulong uVar23;
  int y;
  int iVar24;
  uint *puVar25;
  int iVar26;
  uchar *ptrp_end_1;
  long lVar27;
  long lVar28;
  uchar *ptrp_end_2;
  uint *puVar29;
  long lVar30;
  char *pcVar31;
  uchar *ptrp_end;
  uint *puVar32;
  float *pfVar33;
  byte *pbVar34;
  long lVar35;
  uint uVar36;
  uchar *ptrp0_1;
  byte *pbVar37;
  uint uVar38;
  uchar *ptrp_end_3;
  float *pfVar39;
  long lVar40;
  Tfloat dist_1;
  Tfloat dist;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  uint *local_118;
  int local_100;
  Tfloat valm;
  uint *local_f0;
  CImg<unsigned_char> *local_e8;
  uint *local_e0;
  CImg<unsigned_int> *local_d8;
  float *local_d0;
  float *local_c8;
  float local_bc;
  float *local_b8;
  float local_ac;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  CImg<float> cache;
  CImg<unsigned_int> local_50;
  
  local_e8 = colormap;
  local_d8 = __return_storage_ptr__;
  if (colormap->_spectrum == this->_spectrum) {
    bVar7 = is_empty(this);
    pCVar6 = local_d8;
    if (bVar7) {
      local_d8->_data = (uint *)0x0;
      local_d8->_width = 0;
      local_d8->_height = 0;
      local_d8->_depth = 0;
      local_d8->_spectrum = 0;
      local_d8->_is_shared = false;
    }
    else {
      if (map_indexes) {
        uVar36 = this->_spectrum;
      }
      else {
        uVar36 = 1;
      }
      lVar40 = (ulong)this->_height * (ulong)this->_width * (ulong)this->_depth;
      lVar35 = (ulong)local_e8->_height * (ulong)local_e8->_width * (ulong)local_e8->_depth;
      CImg(local_d8,this->_width,this->_height,this->_depth,uVar36);
      puVar15 = pCVar6->_data;
      if (dithering <= 0.0) {
        uVar36 = this->_spectrum;
        if (uVar36 == 1) {
          for (lVar40 = 0; lVar40 < (int)this->_depth; lVar40 = lVar40 + 1) {
            puVar8 = this->_data;
            for (lVar13 = 0; lVar13 < (int)this->_height; lVar13 = lVar13 + 1) {
              puVar18 = puVar15 + lVar13 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar40 * (ulong)local_d8->_height;
              uVar36 = this->_width;
              puVar10 = puVar8 + (ulong)((int)lVar13 * uVar36) +
                                 (ulong)this->_height * lVar40 * (ulong)uVar36;
              puVar25 = puVar10 + uVar36;
              pbVar4 = local_e8->_data;
              for (; puVar10 < puVar25; puVar10 = puVar10 + 1) {
                pbVar9 = pbVar4;
                pbVar34 = pbVar4;
                fVar42 = 3.4e+38;
                while (fVar41 = fVar42, pbVar34 < pbVar4 + lVar35) {
                  fVar42 = ((float)*pbVar34 - (float)*puVar10) * ((float)*pbVar34 - (float)*puVar10)
                  ;
                  if (fVar42 < fVar41) {
                    pbVar9 = pbVar34;
                  }
                  pbVar34 = pbVar34 + 1;
                  if (fVar41 <= fVar42) {
                    fVar42 = fVar41;
                  }
                }
                if (map_indexes) {
                  uVar36 = (uint)*pbVar9;
                }
                else {
                  uVar36 = (int)pbVar9 - (int)pbVar4;
                }
                *puVar18 = uVar36;
                puVar18 = puVar18 + 1;
              }
            }
          }
        }
        else if (uVar36 == 3) {
          for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
            puVar8 = this->_data;
            for (lVar28 = 0; lVar28 < (int)this->_height; lVar28 = lVar28 + 1) {
              puVar18 = puVar15 + lVar28 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar13 * (ulong)local_d8->_height;
              puVar10 = puVar18 + lVar40;
              puVar25 = puVar10 + lVar40;
              uVar36 = this->_width;
              puVar21 = puVar8 + (ulong)((int)lVar28 * uVar36) +
                                 (ulong)this->_height * lVar13 * (ulong)uVar36;
              puVar29 = puVar21 + lVar40;
              puVar32 = puVar29 + lVar40;
              puVar1 = puVar21 + uVar36;
              pbVar4 = local_e8->_data;
              for (; puVar21 < puVar1; puVar21 = puVar21 + 1) {
                pbVar9 = pbVar4;
                pbVar34 = pbVar4;
                fVar42 = 3.4e+38;
                while (fVar41 = fVar42, pbVar9 < pbVar4 + lVar35) {
                  fVar42 = ((float)pbVar9[lVar35 * 2] - (float)*puVar32) *
                           ((float)pbVar9[lVar35 * 2] - (float)*puVar32) +
                           ((float)*pbVar9 - (float)*puVar21) * ((float)*pbVar9 - (float)*puVar21) +
                           ((float)pbVar9[lVar35] - (float)*puVar29) *
                           ((float)pbVar9[lVar35] - (float)*puVar29);
                  if (fVar42 < fVar41) {
                    pbVar34 = pbVar9;
                  }
                  pbVar9 = pbVar9 + 1;
                  if (fVar41 <= fVar42) {
                    fVar42 = fVar41;
                  }
                }
                if (map_indexes) {
                  *puVar18 = (uint)*pbVar34;
                  *puVar10 = (uint)pbVar34[lVar35];
                  puVar10 = puVar10 + 1;
                  *puVar25 = (uint)pbVar34[lVar35 * 2];
                  puVar25 = puVar25 + 1;
                }
                else {
                  *puVar18 = (int)pbVar34 - (int)pbVar4;
                }
                puVar29 = puVar29 + 1;
                puVar32 = puVar32 + 1;
                puVar18 = puVar18 + 1;
              }
            }
          }
        }
        else if (uVar36 == 2) {
          for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
            puVar8 = this->_data;
            for (lVar28 = 0; lVar28 < (int)this->_height; lVar28 = lVar28 + 1) {
              puVar18 = puVar15 + lVar28 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar13 * (ulong)local_d8->_height;
              puVar10 = puVar18 + lVar40;
              uVar36 = this->_width;
              puVar25 = puVar8 + (ulong)((int)lVar28 * uVar36) +
                                 (ulong)this->_height * lVar13 * (ulong)uVar36;
              puVar21 = puVar25 + lVar40;
              puVar29 = puVar25 + uVar36;
              pbVar4 = local_e8->_data;
              for (; puVar25 < puVar29; puVar25 = puVar25 + 1) {
                pbVar9 = pbVar4;
                pbVar34 = pbVar4;
                fVar42 = 3.4e+38;
                while (fVar41 = fVar42, pbVar9 < pbVar4 + lVar35) {
                  fVar42 = ((float)*pbVar9 - (float)*puVar25) * ((float)*pbVar9 - (float)*puVar25) +
                           ((float)pbVar9[lVar35] - (float)*puVar21) *
                           ((float)pbVar9[lVar35] - (float)*puVar21);
                  if (fVar42 < fVar41) {
                    pbVar34 = pbVar9;
                  }
                  pbVar9 = pbVar9 + 1;
                  if (fVar41 <= fVar42) {
                    fVar42 = fVar41;
                  }
                }
                if (map_indexes) {
                  *puVar18 = (uint)*pbVar34;
                  *puVar10 = (uint)pbVar34[lVar35];
                  puVar10 = puVar10 + 1;
                }
                else {
                  *puVar18 = (int)pbVar34 - (int)pbVar4;
                }
                puVar21 = puVar21 + 1;
                puVar18 = puVar18 + 1;
              }
            }
          }
        }
        else {
          for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
            puVar8 = this->_data;
            for (lVar28 = 0; lVar28 < (int)this->_height; lVar28 = lVar28 + 1) {
              puVar18 = puVar15 + lVar28 * (ulong)local_d8->_width +
                                  (ulong)local_d8->_width * lVar13 * (ulong)local_d8->_height;
              uVar36 = this->_width;
              puVar10 = puVar8 + (ulong)((int)lVar28 * uVar36) +
                                 (ulong)this->_height * lVar13 * (ulong)uVar36;
              puVar25 = puVar10 + uVar36;
              pbVar4 = local_e8->_data;
              for (; puVar10 < puVar25; puVar10 = puVar10 + 1) {
                uVar36 = this->_spectrum;
                uVar17 = 0;
                if (0 < (int)uVar36) {
                  uVar17 = uVar36;
                }
                fVar42 = 3.4e+38;
                pbVar9 = pbVar4;
                for (pbVar34 = pbVar4; pbVar34 < pbVar4 + lVar35; pbVar34 = pbVar34 + 1) {
                  fVar41 = 0.0;
                  puVar21 = puVar10;
                  pbVar37 = pbVar34;
                  uVar38 = uVar17;
                  while (bVar7 = uVar38 != 0, uVar38 = uVar38 - 1, bVar7) {
                    fVar41 = fVar41 + ((float)*puVar21 - (float)*pbVar37) *
                                      ((float)*puVar21 - (float)*pbVar37);
                    pbVar37 = pbVar37 + lVar35;
                    puVar21 = puVar21 + lVar40;
                  }
                  pbVar37 = pbVar34;
                  if (fVar42 <= fVar41) {
                    pbVar37 = pbVar9;
                    fVar41 = fVar42;
                  }
                  fVar42 = fVar41;
                  pbVar9 = pbVar37;
                }
                if (map_indexes) {
                  puVar21 = puVar18;
                  for (iVar26 = 0; iVar26 < (int)uVar36; iVar26 = iVar26 + 1) {
                    *puVar21 = (uint)*pbVar9;
                    pbVar9 = pbVar9 + lVar35;
                    uVar36 = this->_spectrum;
                    puVar21 = puVar21 + lVar40;
                  }
                }
                else {
                  *puVar18 = (int)pbVar9 - (int)pbVar4;
                }
                puVar18 = puVar18 + 1;
              }
            }
          }
        }
      }
      else {
        valm = 0.0;
        puVar8 = max_min<float>(this,&valm);
        local_ac = (float)*puVar8;
        if (((*puVar8 < 0x100) && (valm == local_ac)) && (0.0 <= valm)) {
          valm = 0.0;
          local_ac = 255.0;
        }
        get_crop(&local_50,this,-1,0,0,0,this->_width,1,0,this->_spectrum - 1,false);
        CImg<float>::CImg<unsigned_int>(&cache,&local_50);
        local_bc = 1.0;
        if (dithering <= 1.0) {
          local_bc = dithering;
        }
        local_bc = local_bc * 0.0625;
        ~CImg(&local_50);
        pfVar39 = cache._data + (ulong)cache._width + 1;
        pfVar12 = cache._data + 1;
        lVar13 = (ulong)cache._height * (ulong)cache._width * (ulong)cache._depth;
        uVar36 = this->_spectrum;
        if (uVar36 == 3) {
          local_f0 = puVar15 + lVar40;
          local_e0 = local_f0 + lVar40;
          local_98 = lVar40 * 8;
          local_a0 = 0;
          lVar28 = 0;
          while (lVar30 = lVar28, lVar30 < (int)this->_depth) {
            local_78 = this->_data;
            local_80 = local_78 + lVar40 * 2;
            local_88 = local_78 + lVar40;
            iVar26 = 0;
            local_a8 = CONCAT44(local_a8._4_4_,1);
            pfVar11 = pfVar12;
            pfVar12 = pfVar39;
            while( true ) {
              pfVar39 = pfVar12;
              pfVar12 = pfVar11;
              uVar36 = this->_height;
              if ((int)uVar36 <= iVar26) break;
              local_b8 = (float *)CONCAT44(local_b8._4_4_,iVar26);
              if (iVar26 < (int)(uVar36 - 2)) {
                uVar17 = this->_width;
                uVar38 = 0;
                if (0 < (int)uVar17) {
                  uVar38 = uVar17;
                }
                lVar28 = (ulong)uVar36 * local_a0 * (ulong)uVar17 +
                         (ulong)(uVar17 * (int)local_a8) * 4;
                for (lVar27 = 0; uVar38 != (uint)lVar27; lVar27 = lVar27 + 1) {
                  pfVar39[lVar27] = (float)*(uint *)((long)local_78 + lVar27 * 4 + lVar28);
                  pfVar39[lVar13 + lVar27] = (float)*(uint *)((long)local_88 + lVar27 * 4 + lVar28);
                  pfVar39[lVar13 * 2 + lVar27] =
                       (float)*(uint *)((long)local_80 + lVar27 * 4 + lVar28);
                }
              }
              pfVar11 = pfVar39 + lVar13;
              pfVar33 = pfVar12 + lVar13;
              pfVar22 = pfVar33 + lVar13;
              pfVar20 = pfVar11 + lVar13;
              pbVar4 = local_e8->_data;
              pfVar14 = pfVar12;
              pfVar19 = pfVar39;
              for (iVar24 = 0; iVar24 < (int)this->_width; iVar24 = iVar24 + 1) {
                fVar42 = *pfVar14;
                fVar41 = local_ac;
                if (fVar42 <= local_ac) {
                  fVar41 = fVar42;
                }
                fVar43 = (float)(-(uint)(fVar42 < valm) & (uint)valm |
                                ~-(uint)(fVar42 < valm) & (uint)fVar41);
                fVar42 = *pfVar33;
                fVar41 = local_ac;
                if (fVar42 <= local_ac) {
                  fVar41 = fVar42;
                }
                fVar41 = (float)(-(uint)(fVar42 < valm) & (uint)valm |
                                ~-(uint)(fVar42 < valm) & (uint)fVar41);
                fVar42 = *pfVar22;
                fVar45 = local_ac;
                if (fVar42 <= local_ac) {
                  fVar45 = fVar42;
                }
                fVar42 = (float)(-(uint)(fVar42 < valm) & (uint)valm |
                                ~-(uint)(fVar42 < valm) & (uint)fVar45);
                pbVar9 = pbVar4;
                pbVar34 = pbVar4;
                fVar45 = 3.4e+38;
                while (fVar44 = fVar45, pbVar34 < pbVar4 + lVar35) {
                  fVar45 = ((float)pbVar34[lVar35 * 2] - fVar42) *
                           ((float)pbVar34[lVar35 * 2] - fVar42) +
                           ((float)*pbVar34 - fVar43) * ((float)*pbVar34 - fVar43) +
                           ((float)pbVar34[lVar35] - fVar41) * ((float)pbVar34[lVar35] - fVar41);
                  if (fVar45 < fVar44) {
                    pbVar9 = pbVar34;
                  }
                  pbVar34 = pbVar34 + 1;
                  if (fVar44 <= fVar45) {
                    fVar45 = fVar44;
                  }
                }
                *pfVar14 = fVar43;
                bVar2 = *pbVar9;
                *pfVar33 = fVar41;
                fVar43 = (fVar43 - (float)bVar2) * local_bc;
                fVar41 = (fVar41 - (float)pbVar9[lVar35]) * local_bc;
                *pfVar22 = fVar42;
                fVar42 = (fVar42 - (float)pbVar9[lVar35 * 2]) * local_bc;
                pfVar14[1] = fVar43 * 7.0 + pfVar14[1];
                pfVar33[1] = fVar41 * 7.0 + pfVar33[1];
                pfVar22[1] = fVar42 * 7.0 + pfVar22[1];
                pfVar19[-1] = fVar43 * 3.0 + pfVar19[-1];
                pfVar11[-1] = fVar41 * 3.0 + pfVar11[-1];
                pfVar20[-1] = fVar42 * 3.0 + pfVar20[-1];
                *pfVar19 = fVar43 * 5.0 + *pfVar19;
                *pfVar11 = fVar41 * 5.0 + *pfVar11;
                *pfVar20 = fVar42 * 5.0 + *pfVar20;
                pfVar19[1] = fVar43 + pfVar19[1];
                pfVar11[1] = fVar41 + pfVar11[1];
                pfVar20[1] = fVar42 + pfVar20[1];
                if (map_indexes) {
                  *puVar15 = (uint)*pbVar9;
                  *local_f0 = (uint)pbVar9[lVar35];
                  local_f0 = local_f0 + 1;
                  *local_e0 = (uint)pbVar9[lVar35 * 2];
                  local_e0 = local_e0 + 1;
                }
                else {
                  local_100 = (int)pbVar4;
                  *puVar15 = (int)pbVar9 - local_100;
                }
                pfVar14 = pfVar14 + 1;
                pfVar33 = pfVar33 + 1;
                pfVar22 = pfVar22 + 1;
                pfVar19 = pfVar19 + 1;
                pfVar11 = pfVar11 + 1;
                pfVar20 = pfVar20 + 1;
                puVar15 = puVar15 + 1;
              }
              iVar26 = iVar26 + 1;
              local_a8 = CONCAT44(local_a8._4_4_,(int)local_a8 + 1);
              pfVar11 = pfVar39;
              local_c8 = pfVar39;
            }
            local_a0 = local_a0 + 4;
            local_d0 = pfVar12;
            local_90 = lVar30;
            lVar28 = lVar30 + 1;
          }
        }
        else if (uVar36 == 2) {
          local_118 = puVar15 + lVar40;
          local_e0 = (uint *)0x0;
          lVar28 = 0;
          while (lVar30 = lVar28, lVar30 < (int)this->_depth) {
            local_d0 = (float *)this->_data;
            local_b8 = local_d0 + lVar40;
            iVar26 = 0;
            local_f0 = (uint *)CONCAT44(local_f0._4_4_,1);
            pfVar11 = pfVar12;
            pfVar12 = pfVar39;
            while( true ) {
              pfVar39 = pfVar12;
              pfVar12 = pfVar11;
              uVar36 = this->_height;
              if ((int)uVar36 <= iVar26) break;
              if (iVar26 < (int)(uVar36 - 2)) {
                uVar17 = this->_width;
                uVar38 = 0;
                if (0 < (int)uVar17) {
                  uVar38 = uVar17;
                }
                lVar28 = (ulong)uVar36 * (long)local_e0 * (ulong)uVar17 +
                         (ulong)(uVar17 * (int)local_f0) * 4;
                for (lVar27 = 0; uVar38 != (uint)lVar27; lVar27 = lVar27 + 1) {
                  pfVar39[lVar27] = (float)*(uint *)((long)local_d0 + lVar27 * 4 + lVar28);
                  pfVar39[lVar13 + lVar27] = (float)*(uint *)((long)local_b8 + lVar27 * 4 + lVar28);
                }
              }
              pfVar11 = pfVar39 + lVar13;
              pfVar33 = pfVar12 + lVar13;
              pbVar4 = local_e8->_data;
              pfVar22 = pfVar39;
              pfVar20 = pfVar12;
              for (iVar24 = 0; iVar24 < (int)this->_width; iVar24 = iVar24 + 1) {
                fVar42 = *pfVar20;
                fVar41 = local_ac;
                if (fVar42 <= local_ac) {
                  fVar41 = fVar42;
                }
                fVar41 = (float)(-(uint)(fVar42 < valm) & (uint)valm |
                                ~-(uint)(fVar42 < valm) & (uint)fVar41);
                fVar42 = *pfVar33;
                fVar43 = local_ac;
                if (fVar42 <= local_ac) {
                  fVar43 = fVar42;
                }
                fVar43 = (float)(-(uint)(fVar42 < valm) & (uint)valm |
                                ~-(uint)(fVar42 < valm) & (uint)fVar43);
                pbVar9 = pbVar4;
                pbVar34 = pbVar4;
                fVar42 = 3.4e+38;
                while (fVar45 = fVar42, pbVar34 < pbVar4 + lVar35) {
                  fVar42 = ((float)*pbVar34 - fVar41) * ((float)*pbVar34 - fVar41) +
                           ((float)pbVar34[lVar35] - fVar43) * ((float)pbVar34[lVar35] - fVar43);
                  if (fVar42 < fVar45) {
                    pbVar9 = pbVar34;
                  }
                  pbVar34 = pbVar34 + 1;
                  if (fVar45 <= fVar42) {
                    fVar42 = fVar45;
                  }
                }
                *pfVar20 = fVar41;
                fVar42 = (fVar41 - (float)*pbVar9) * local_bc;
                *pfVar33 = fVar43;
                fVar41 = (fVar43 - (float)pbVar9[lVar35]) * local_bc;
                pfVar20[1] = fVar42 * 7.0 + pfVar20[1];
                pfVar33[1] = fVar41 * 7.0 + pfVar33[1];
                pfVar22[-1] = fVar42 * 3.0 + pfVar22[-1];
                pfVar11[-1] = fVar41 * 3.0 + pfVar11[-1];
                *pfVar22 = fVar42 * 5.0 + *pfVar22;
                *pfVar11 = fVar41 * 5.0 + *pfVar11;
                pfVar22[1] = fVar42 + pfVar22[1];
                pfVar11[1] = fVar41 + pfVar11[1];
                if (map_indexes) {
                  *puVar15 = (uint)*pbVar9;
                  *local_118 = (uint)pbVar9[lVar35];
                  local_118 = local_118 + 1;
                }
                else {
                  *puVar15 = (int)pbVar9 - (int)pbVar4;
                }
                pfVar20 = pfVar20 + 1;
                pfVar33 = pfVar33 + 1;
                pfVar22 = pfVar22 + 1;
                pfVar11 = pfVar11 + 1;
                puVar15 = puVar15 + 1;
              }
              iVar26 = iVar26 + 1;
              local_f0 = (uint *)CONCAT44(local_f0._4_4_,(int)local_f0 + 1);
              pfVar11 = pfVar39;
              local_c8 = pfVar39;
            }
            local_e0 = local_e0 + 1;
            local_a8 = lVar30;
            lVar28 = lVar30 + 1;
          }
        }
        else if (uVar36 == 1) {
          local_118 = (uint *)0x0;
          for (lVar40 = 0; lVar40 < (int)this->_depth; lVar40 = lVar40 + 1) {
            puVar8 = this->_data;
            iVar24 = 0;
            iVar26 = 1;
            pfVar11 = pfVar12;
            while( true ) {
              pfVar12 = pfVar11;
              uVar36 = this->_height;
              if ((int)uVar36 <= iVar24) break;
              if (iVar24 < (int)(uVar36 - 2)) {
                uVar17 = this->_width;
                uVar38 = 0;
                if (0 < (int)uVar17) {
                  uVar38 = uVar17;
                }
                for (lVar13 = 0; uVar38 != (uint)lVar13; lVar13 = lVar13 + 1) {
                  pfVar39[lVar13] =
                       (float)*(uint *)((long)puVar8 +
                                       lVar13 * 4 +
                                       (ulong)uVar36 * (long)local_118 * (ulong)uVar17 +
                                       (ulong)(uVar17 * iVar26) * 4);
                }
              }
              pbVar4 = local_e8->_data;
              pfVar11 = pfVar39;
              pfVar33 = pfVar12;
              for (iVar16 = 0; iVar16 < (int)this->_width; iVar16 = iVar16 + 1) {
                fVar42 = *pfVar33;
                fVar41 = local_ac;
                if (fVar42 <= local_ac) {
                  fVar41 = fVar42;
                }
                fVar41 = (float)(-(uint)(fVar42 < valm) & (uint)valm |
                                ~-(uint)(fVar42 < valm) & (uint)fVar41);
                pbVar9 = pbVar4;
                pbVar34 = pbVar4;
                fVar42 = 3.4e+38;
                while (fVar43 = fVar42, pbVar9 < pbVar4 + lVar35) {
                  fVar42 = ((float)*pbVar9 - fVar41) * ((float)*pbVar9 - fVar41);
                  if (fVar42 < fVar43) {
                    pbVar34 = pbVar9;
                  }
                  pbVar9 = pbVar9 + 1;
                  if (fVar43 <= fVar42) {
                    fVar42 = fVar43;
                  }
                }
                *pfVar33 = fVar41;
                fVar42 = (fVar41 - (float)*pbVar34) * local_bc;
                pfVar33[1] = fVar42 * 7.0 + pfVar33[1];
                pfVar11[-1] = fVar42 * 3.0 + pfVar11[-1];
                *pfVar11 = fVar42 * 5.0 + *pfVar11;
                pfVar11[1] = fVar42 + pfVar11[1];
                if (map_indexes) {
                  uVar36 = (uint)*pbVar34;
                }
                else {
                  uVar36 = (int)pbVar34 - (int)pbVar4;
                }
                pfVar33 = pfVar33 + 1;
                pfVar11 = pfVar11 + 1;
                *puVar15 = uVar36;
                puVar15 = puVar15 + 1;
              }
              iVar24 = iVar24 + 1;
              iVar26 = iVar26 + 1;
              pfVar11 = pfVar39;
              pfVar39 = pfVar12;
            }
            local_118 = (uint *)((long)local_118 + 4);
          }
        }
        else {
          local_b8 = (float *)0x0;
          pfVar11 = (float *)0x0;
          while (pfVar33 = pfVar11, (long)pfVar33 < (long)(int)this->_depth) {
            iVar26 = 0;
            local_e0 = (uint *)CONCAT44(local_e0._4_4_,1);
            pfVar11 = pfVar12;
            pfVar12 = pfVar39;
            while( true ) {
              pfVar39 = pfVar12;
              pfVar12 = pfVar11;
              uVar36 = this->_height;
              if ((int)uVar36 <= iVar26) break;
              local_f0 = (uint *)CONCAT44(local_f0._4_4_,iVar26);
              if (iVar26 < (int)(uVar36 - 2)) {
                uVar17 = this->_width;
                uVar38 = 0;
                if (0 < (int)uVar17) {
                  uVar38 = uVar17;
                }
                uVar5 = this->_spectrum;
                if ((int)this->_spectrum < 1) {
                  uVar5 = 0;
                }
                uVar3 = this->_depth;
                lVar28 = (ulong)uVar36 * (ulong)uVar17 * (long)local_b8 +
                         (ulong)(uVar17 * (int)local_e0) * 4 + (long)this->_data;
                pfVar11 = pfVar39;
                for (uVar23 = 0; uVar23 != uVar5; uVar23 = uVar23 + 1) {
                  for (lVar30 = 0; uVar38 != (uint)lVar30; lVar30 = lVar30 + 1) {
                    pfVar11[lVar30] = (float)*(uint *)(lVar28 + lVar30 * 4);
                  }
                  pfVar11 = pfVar11 + lVar13;
                  lVar28 = lVar28 + (ulong)uVar36 * (ulong)uVar17 * (ulong)uVar3 * 4;
                }
              }
              pbVar4 = local_e8->_data;
              pfVar11 = pfVar12;
              pfVar22 = pfVar39;
              for (iVar24 = 0; iVar24 < (int)this->_width; iVar24 = iVar24 + 1) {
                uVar36 = this->_spectrum;
                if ((int)this->_spectrum < 1) {
                  uVar36 = 0;
                }
                fVar42 = 3.4e+38;
                pbVar9 = pbVar4;
                for (pbVar34 = pbVar4; pbVar34 < pbVar4 + lVar35; pbVar34 = pbVar34 + 1) {
                  fVar41 = 0.0;
                  pfVar20 = pfVar11;
                  pbVar37 = pbVar34;
                  uVar17 = uVar36;
                  while (bVar7 = uVar17 != 0, uVar17 = uVar17 - 1, bVar7) {
                    fVar43 = *pfVar20;
                    fVar45 = local_ac;
                    if (fVar43 <= local_ac) {
                      fVar45 = fVar43;
                    }
                    fVar43 = (float)(-(uint)(fVar43 < valm) & (uint)valm |
                                    ~-(uint)(fVar43 < valm) & (uint)fVar45);
                    *pfVar20 = fVar43;
                    fVar43 = fVar43 - (float)*pbVar37;
                    fVar41 = fVar41 + fVar43 * fVar43;
                    pbVar37 = pbVar37 + lVar35;
                    pfVar20 = pfVar20 + lVar13;
                  }
                  pbVar37 = pbVar34;
                  if (fVar42 <= fVar41) {
                    fVar41 = fVar42;
                    pbVar37 = pbVar9;
                  }
                  pbVar9 = pbVar37;
                  fVar42 = fVar41;
                }
                uVar36 = this->_spectrum;
                if ((int)this->_spectrum < 1) {
                  uVar36 = 0;
                }
                lVar28 = 4;
                pbVar34 = pbVar9;
                while (bVar7 = uVar36 != 0, uVar36 = uVar36 - 1, bVar7) {
                  fVar41 = (*(float *)((long)pfVar11 + lVar28 + -4) - (float)*pbVar34) * local_bc;
                  *(float *)((long)pfVar11 + lVar28) =
                       fVar41 * 7.0 + *(float *)((long)pfVar11 + lVar28);
                  pfVar20 = (float *)((long)pfVar22 + lVar28 + -8);
                  fVar42 = pfVar20[1];
                  pfVar14 = (float *)((long)pfVar22 + lVar28 + -8);
                  *pfVar14 = fVar41 * 3.0 + *pfVar20;
                  pfVar14[1] = fVar41 * 5.0 + fVar42;
                  *(float *)((long)pfVar22 + lVar28) = fVar41 + *(float *)((long)pfVar22 + lVar28);
                  pbVar34 = pbVar34 + lVar35;
                  lVar28 = lVar28 + lVar13 * 4;
                }
                if (map_indexes) {
                  puVar8 = puVar15;
                  for (iVar16 = 0; iVar16 < (int)this->_spectrum; iVar16 = iVar16 + 1) {
                    *puVar8 = (uint)*pbVar9;
                    pbVar9 = pbVar9 + lVar35;
                    puVar8 = puVar8 + lVar40;
                  }
                }
                else {
                  local_118._0_4_ = (int)pbVar4;
                  *puVar15 = (int)pbVar9 - (int)local_118;
                }
                pfVar22 = pfVar22 + 1;
                puVar15 = puVar15 + 1;
                pfVar11 = pfVar11 + 1;
              }
              iVar26 = iVar26 + 1;
              local_e0 = (uint *)CONCAT44(local_e0._4_4_,(int)local_e0 + 1);
              pfVar11 = pfVar39;
              local_c8 = pfVar39;
            }
            local_b8 = local_b8 + 1;
            local_d0 = pfVar33;
            pfVar11 = (float *)((long)pfVar33 + 1);
          }
        }
        CImg<float>::~CImg(&cache);
      }
    }
    return local_d8;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  pcVar31 = "non-";
  if (this->_is_shared != false) {
    pcVar31 = "";
  }
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
             ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar31,"unsigned int",(ulong)local_e8->_width,(ulong)local_e8->_height,
             (ulong)local_e8->_depth,(ulong)local_e8->_spectrum,local_e8->_data);
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const unsigned long whd = (unsigned long)_width*_height*_depth, pwhd = (unsigned long)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      tuint *ptrd = res._data;
      if (dithering>0) { // Dithered versions.
        const float ndithering = (dithering<0?0:dithering>1?1:dithering)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum-1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const unsigned long cwhd = (unsigned long)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars.
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y+1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0-1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2d vectors.
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3d vectors (colors).
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1, pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1; *(ptrsn2-1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y+1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++)-1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd-1; _ptrsn+=cwhd-2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }